

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.c
# Opt level: O0

Value * apply_check_smaller_operation(Value *left_value,Value *right_value)

{
  longlong lVar1;
  longlong lVar2;
  undefined1 auStack_48 [8];
  longdouble right_float;
  longdouble left_float;
  Value *right_value_local;
  Value *left_value_local;
  
  if ((left_value->value_type == ValueTypeIntegerValue) &&
     (right_value->value_type == ValueTypeIntegerValue)) {
    left_value_local = new_bool_value(*(long *)(left_value + 1) < *(long *)(right_value + 1));
  }
  else if (((left_value->value_type == ValueTypeIntegerValue) ||
           (left_value->value_type == ValueTypeFloatValue)) &&
          ((right_value->value_type == ValueTypeIntegerValue ||
           (right_value->value_type == ValueTypeFloatValue)))) {
    if (left_value->value_type == ValueTypeFloatValue) {
      unique0x00006f00 = *(longdouble *)&left_value[1].linked_variable_count;
    }
    else {
      register0x00001100 = (longdouble)*(long *)(left_value + 1);
    }
    if (right_value->value_type == ValueTypeFloatValue) {
      _auStack_48 = *(longdouble *)&right_value[1].linked_variable_count;
    }
    else {
      _auStack_48 = (longdouble)*(long *)(right_value + 1);
    }
    left_value_local = new_bool_value(stack0xffffffffffffffc8 < _auStack_48);
  }
  else {
    lVar1 = convert_to_integer(left_value);
    lVar2 = convert_to_integer(right_value);
    left_value_local = new_bool_value(lVar1 < lVar2);
  }
  return left_value_local;
}

Assistant:

Value *apply_check_smaller_operation(Value *left_value, Value *right_value) {
  if (left_value->value_type == ValueTypeIntegerValue && right_value->value_type == ValueTypeIntegerValue) {
    return new_bool_value(((IntegerValue *) left_value)->integer_value < ((IntegerValue *) right_value)->integer_value);
  }
  else if ((left_value->value_type == ValueTypeIntegerValue || left_value->value_type == ValueTypeFloatValue) && (right_value->value_type == ValueTypeIntegerValue || right_value->value_type == ValueTypeFloatValue)) {
    long double left_float, right_float;

    if (left_value->value_type == ValueTypeFloatValue) left_float = ((FloatValue *) left_value)->float_value;
    else left_float = ((IntegerValue *) left_value)->integer_value;

    if (right_value->value_type == ValueTypeFloatValue) right_float = ((FloatValue *) right_value)->float_value;
    else right_float = ((IntegerValue *) right_value)->integer_value;

    return new_bool_value(left_float < right_float);
  }

  return new_bool_value(convert_to_integer(left_value) < convert_to_integer(right_value));
}